

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAddr.cpp
# Opt level: O3

Error __thiscall
llvm::DWARFDebugAddrTable::extract
          (DWARFDebugAddrTable *this,DWARFDataExtractor Data,uint64_t *OffsetPtr,uint16_t Version,
          uint8_t AddrSize,function<void_(llvm::Error)> *WarnCallback)

{
  unsigned_long *puVar1;
  byte *Vals_2;
  byte bVar2;
  ulong uVar3;
  iterator __position;
  byte bVar4;
  ushort uVar5;
  DWARFDebugAddrTable *pDVar6;
  uint8_t uVar7;
  uint16_t uVar8;
  uint32_t uVar9;
  char *pcVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  char *Vals;
  undefined6 in_register_00000012;
  uint64_t *offset_ptr;
  uint uVar12;
  long in_R9;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  error_code EC_04;
  error_code EC_05;
  error_code EC_06;
  error_code EC_07;
  error_code EC_08;
  ulong local_68;
  unsigned_long *local_60;
  unsigned_long local_58;
  uint32_t TmpLength;
  ushort local_4a;
  DWARFDebugAddrTable *pDStack_48;
  uint16_t UnitVersion;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  byte local_31;
  uint8_t AddrSize_local;
  
  offset_ptr = (uint64_t *)CONCAT62(in_register_00000012,Version);
  bVar4 = (byte)WarnCallback;
  local_4a = (ushort)CONCAT71(in_register_00000009,AddrSize);
  *(undefined4 *)((long)OffsetPtr + 0x14) = 5;
  if (OffsetPtr[5] != OffsetPtr[4]) {
    OffsetPtr[5] = OffsetPtr[4];
  }
  *(undefined4 *)(OffsetPtr + 2) = 0;
  uVar3 = *offset_ptr;
  OffsetPtr[1] = uVar3;
  pDStack_48 = this;
  local_31 = bVar4;
  if ((0xfffffffffffffffb < uVar3) || (Data.super_DataExtractor.Data.Length <= uVar3 + 3)) {
    pcVar10 = (char *)std::_V2::generic_category();
    pDVar6 = pDStack_48;
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = pDStack_48;
    createStringError<unsigned_long>
              (EC,pcVar10,
               (unsigned_long *)
               "section is not large enough to contain a .debug_addr table length at offset 0x%lx");
    return (Error)(ErrorInfoBase *)pDVar6;
  }
  puVar1 = (unsigned_long *)((long)OffsetPtr + 0x14);
  Vals_2 = (byte *)((long)OffsetPtr + 0x16);
  local_40 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(OffsetPtr + 1);
  if (local_4a == 0) {
    local_60 = puVar1;
    pcVar10 = (char *)std::_V2::generic_category();
    EC_00._M_cat = (error_category *)0x16;
    EC_00._0_8_ = &local_68;
    createStringError(EC_00,pcVar10);
    if (*(long *)(in_R9 + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(in_R9 + 0x18))();
    if ((long *)(local_68 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_68 & 0xfffffffffffffffe) + 8))();
    }
    local_4a = 5;
    *(undefined1 *)OffsetPtr = 0;
    puVar1 = local_60;
  }
  else {
    *(undefined1 *)OffsetPtr = 0;
    if (local_4a < 5) {
      *(ushort *)puVar1 = local_4a;
      *Vals_2 = bVar4;
      *(char *)((long)OffsetPtr + 0x17) = '\0';
      if (Data.Section == (DWARFSection *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (uint)((Data.Section)->Data).Length;
      }
      *(uint *)(OffsetPtr + 3) = uVar11;
      goto LAB_00d5dd72;
    }
  }
  local_60 = puVar1;
  uVar5 = local_4a;
  uVar9 = DataExtractor::getU32(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
  *(uint32_t *)(OffsetPtr + 2) = uVar9;
  if (uVar9 == 0xffffffff) {
    *(undefined4 *)(OffsetPtr + 2) = 0;
    pcVar10 = (char *)std::_V2::generic_category();
    pDVar6 = pDStack_48;
    EC_02._M_cat = (error_category *)0x5f;
    EC_02._0_8_ = pDStack_48;
    createStringError<unsigned_long>
              (EC_02,pcVar10,
               (unsigned_long *)"DWARF64 is not supported in .debug_addr at offset 0x%lx");
    return (Error)(ErrorInfoBase *)pDVar6;
  }
  if (uVar9 < 4) {
    uVar11 = uVar9 | 4;
    if (uVar9 == 0) {
      uVar11 = 0;
    }
    local_58 = CONCAT44(local_58._4_4_,uVar11);
    *(undefined4 *)(OffsetPtr + 2) = 0;
    pcVar10 = (char *)std::_V2::generic_category();
    pDVar6 = pDStack_48;
    EC_01._M_cat = (error_category *)0x16;
    EC_01._0_8_ = pDStack_48;
    createStringError<unsigned_long,unsigned_int>
              (EC_01,pcVar10,
               (unsigned_long *)
               ".debug_addr table at offset 0x%lx has too small length (0x%x) to contain a complete header"
               ,(uint *)local_40);
    return (Error)(ErrorInfoBase *)pDVar6;
  }
  uVar3 = *(ulong *)local_40;
  uVar11 = uVar9 + 4;
  if ((uVar3 + uVar11 < uVar3) || (Data.super_DataExtractor.Data.Length <= (uVar3 + uVar11) - 1)) {
    local_58 = CONCAT44(local_58._4_4_,uVar11);
    *(undefined4 *)(OffsetPtr + 2) = 0;
    pcVar10 = (char *)std::_V2::generic_category();
    pDVar6 = pDStack_48;
    EC_06._M_cat = (error_category *)0x16;
    EC_06._0_8_ = pDStack_48;
    createStringError<unsigned_int,unsigned_long>
              (EC_06,pcVar10,
               (uint *)
               "section is not large enough to contain a .debug_addr table of length 0x%x at offset 0x%lx"
               ,&local_58);
    return (Error)(ErrorInfoBase *)pDVar6;
  }
  uVar8 = DataExtractor::getU16(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
  *(uint16_t *)((long)OffsetPtr + 0x14) = uVar8;
  uVar7 = DataExtractor::getU8(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
  *(uint8_t *)((long)OffsetPtr + 0x16) = uVar7;
  uVar7 = DataExtractor::getU8(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
  *(uint8_t *)((long)OffsetPtr + 0x17) = uVar7;
  uVar11 = getDataSize((DWARFDebugAddrTable *)OffsetPtr);
  *(uint *)(OffsetPtr + 3) = uVar11;
  if (5 < *(ushort *)((long)OffsetPtr + 0x14)) {
    pcVar10 = (char *)std::_V2::generic_category();
    pDVar6 = pDStack_48;
    EC_03._M_cat = (error_category *)0x5f;
    EC_03._0_8_ = pDStack_48;
    createStringError<unsigned_short,unsigned_long>
              (EC_03,pcVar10,
               (unsigned_short *)
               "version %u of .debug_addr section at offset 0x%lx is not supported",local_60);
    return (Error)(ErrorInfoBase *)pDVar6;
  }
  if (*(ushort *)((long)OffsetPtr + 0x14) != uVar5) {
    pcVar10 = (char *)std::_V2::generic_category();
    pDVar6 = pDStack_48;
    EC_07._M_cat = (error_category *)0x16;
    EC_07._0_8_ = pDStack_48;
    createStringError<unsigned_long,unsigned_short,unsigned_short>
              (EC_07,pcVar10,
               (unsigned_long *)
               ".debug_addr table at offset 0x%lx has version %u which is different from the version suggested by the DWARF unit header: %u"
               ,(unsigned_short *)local_40,(unsigned_short *)local_60);
    return (Error)(ErrorInfoBase *)pDVar6;
  }
LAB_00d5dd72:
  bVar2 = *Vals_2;
  if ((bVar2 == 4) || (bVar2 == 8)) {
    if (bVar4 != 0 && bVar2 != bVar4) {
      pcVar10 = (char *)std::_V2::generic_category();
      pDVar6 = pDStack_48;
      EC_04._M_cat = (error_category *)0x16;
      EC_04._0_8_ = pDStack_48;
      createStringError<unsigned_long,unsigned_char,unsigned_char>
                (EC_04,pcVar10,
                 (unsigned_long *)
                 ".debug_addr table at offset 0x%lx has address size %u which is different from CU address size %u"
                 ,(uchar *)local_40,Vals_2);
      return (Error)(ErrorInfoBase *)pDVar6;
    }
    if (*(char *)((long)OffsetPtr + 0x17) == '\0') {
      if (uVar11 % (uint)bVar2 != 0) {
        *(undefined4 *)(OffsetPtr + 2) = 0;
        pcVar10 = (char *)std::_V2::generic_category();
        pDVar6 = pDStack_48;
        EC_08._M_cat = (error_category *)0x16;
        EC_08._0_8_ = pDStack_48;
        createStringError<unsigned_long,unsigned_int,unsigned_char>
                  (EC_08,pcVar10,
                   (unsigned_long *)
                   ".debug_addr table at offset 0x%lx contains data of size %u which is not a multiple of addr size %u"
                   ,(uint *)local_40,(uchar *)(OffsetPtr + 3));
        return (Error)(ErrorInfoBase *)pDVar6;
      }
      if (bVar2 <= uVar11) {
        local_40 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(OffsetPtr + 4);
        uVar12 = 0;
        Data.super_DataExtractor.AddressSize = bVar2;
        do {
          if (*Vals_2 == 4) {
            uVar9 = DataExtractor::getU32(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
            local_58 = (unsigned_long)uVar9;
          }
          else {
            local_58 = DataExtractor::getU64(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
          }
          __position._M_current = (unsigned_long *)OffsetPtr[5];
          if (__position._M_current == (unsigned_long *)OffsetPtr[6]) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(local_40,__position,&local_58);
          }
          else {
            *__position._M_current = local_58;
            OffsetPtr[5] = (uint64_t)(__position._M_current + 1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar11 / bVar2);
      }
      *(_func_int ***)pDStack_48 = (_func_int **)0x1;
      return (Error)(ErrorInfoBase *)pDStack_48;
    }
    pcVar10 = (char *)std::_V2::generic_category();
    Vals = ".debug_addr table at offset 0x%lx has unsupported segment selector size %u";
  }
  else {
    pcVar10 = (char *)std::_V2::generic_category();
    Vals = ".debug_addr table at offset 0x%lx has unsupported address size %u";
  }
  pDVar6 = pDStack_48;
  EC_05._M_cat = (error_category *)0x5f;
  EC_05._0_8_ = pDStack_48;
  createStringError<unsigned_long,unsigned_char>
            (EC_05,pcVar10,(unsigned_long *)Vals,(uchar *)local_40);
  return (Error)(ErrorInfoBase *)pDVar6;
}

Assistant:

Error DWARFDebugAddrTable::extract(DWARFDataExtractor Data,
                                   uint64_t *OffsetPtr,
                                   uint16_t Version,
                                   uint8_t AddrSize,
                                   std::function<void(Error)> WarnCallback) {
  clear();
  HeaderOffset = *OffsetPtr;
  // Read and verify the length field.
  if (!Data.isValidOffsetForDataOfSize(*OffsetPtr, sizeof(uint32_t)))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a "
                       ".debug_addr table length at offset 0x%"
                       PRIx64, *OffsetPtr);
  uint16_t UnitVersion;
  if (Version == 0) {
    WarnCallback(createStringError(errc::invalid_argument,
                       "DWARF version is not defined in CU,"
                       " assuming version 5"));
    UnitVersion = 5;
  } else {
    UnitVersion = Version;
  }
  // TODO: Add support for DWARF64.
  Format = dwarf::DwarfFormat::DWARF32;
  if (UnitVersion >= 5) {
    HeaderData.Length = Data.getU32(OffsetPtr);
    if (HeaderData.Length == dwarf::DW_LENGTH_DWARF64) {
      invalidateLength();
      return createStringError(errc::not_supported,
          "DWARF64 is not supported in .debug_addr at offset 0x%" PRIx64,
          HeaderOffset);
    }
    if (HeaderData.Length + sizeof(uint32_t) < sizeof(Header)) {
      uint32_t TmpLength = getLength();
      invalidateLength();
      return createStringError(errc::invalid_argument,
                         ".debug_addr table at offset 0x%" PRIx64
                         " has too small length (0x%" PRIx32
                         ") to contain a complete header",
                         HeaderOffset, TmpLength);
    }
    uint64_t End = HeaderOffset + getLength();
    if (!Data.isValidOffsetForDataOfSize(HeaderOffset, End - HeaderOffset)) {
      uint32_t TmpLength = getLength();
      invalidateLength();
      return createStringError(errc::invalid_argument,
          "section is not large enough to contain a .debug_addr table "
          "of length 0x%" PRIx32 " at offset 0x%" PRIx64,
          TmpLength, HeaderOffset);
    }

    HeaderData.Version = Data.getU16(OffsetPtr);
    HeaderData.AddrSize = Data.getU8(OffsetPtr);
    HeaderData.SegSize = Data.getU8(OffsetPtr);
    DataSize = getDataSize();
  } else {
    HeaderData.Version = UnitVersion;
    HeaderData.AddrSize = AddrSize;
    // TODO: Support for non-zero SegSize.
    HeaderData.SegSize = 0;
    DataSize = Data.size();
  }

  // Perform basic validation of the remaining header fields.

  // We support DWARF version 5 for now as well as pre-DWARF5
  // implementations of .debug_addr table, which doesn't contain a header
  // and consists only of a series of addresses.
  if (HeaderData.Version > 5) {
    return createStringError(errc::not_supported, "version %" PRIu16
        " of .debug_addr section at offset 0x%" PRIx64 " is not supported",
        HeaderData.Version, HeaderOffset);
  }
  // FIXME: For now we just treat version mismatch as an error,
  // however the correct way to associate a .debug_addr table
  // with a .debug_info table is to look at the DW_AT_addr_base
  // attribute in the info table.
  if (HeaderData.Version != UnitVersion)
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has version %" PRIu16
                       " which is different from the version suggested"
                       " by the DWARF unit header: %" PRIu16,
                       HeaderOffset, HeaderData.Version, UnitVersion);
  if (HeaderData.AddrSize != 4 && HeaderData.AddrSize != 8)
    return createStringError(errc::not_supported,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has unsupported address size %" PRIu8,
                       HeaderOffset, HeaderData.AddrSize);
  if (HeaderData.AddrSize != AddrSize && AddrSize != 0)
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has address size %" PRIu8
                       " which is different from CU address size %" PRIu8,
                       HeaderOffset, HeaderData.AddrSize, AddrSize);

  // TODO: add support for non-zero segment selector size.
  if (HeaderData.SegSize != 0)
    return createStringError(errc::not_supported,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has unsupported segment selector size %" PRIu8,
                       HeaderOffset, HeaderData.SegSize);
  if (DataSize % HeaderData.AddrSize != 0) {
    invalidateLength();
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " contains data of size %" PRIu32
                       " which is not a multiple of addr size %" PRIu8,
                       HeaderOffset, DataSize, HeaderData.AddrSize);
  }
  Data.setAddressSize(HeaderData.AddrSize);
  uint32_t AddrCount = DataSize / HeaderData.AddrSize;
  for (uint32_t I = 0; I < AddrCount; ++I)
    if (HeaderData.AddrSize == 4)
      Addrs.push_back(Data.getU32(OffsetPtr));
    else
      Addrs.push_back(Data.getU64(OffsetPtr));
  return Error::success();
}